

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_audit.cpp
# Opt level: O2

void compare_single_struct(t_struct *newStruct,t_struct *oldStruct,string *oldStructName)

{
  uint uVar1;
  uint uVar2;
  pointer pptVar3;
  pointer pptVar4;
  t_field *newField;
  t_field *oldField;
  int iVar5;
  undefined4 extraout_var;
  char *fmt;
  pointer pptVar6;
  pointer pptVar7;
  string structName;
  undefined8 local_70 [4];
  string local_50;
  
  if (oldStructName->_M_string_length == 0) {
    iVar5 = (*(oldStruct->super_t_type).super_t_doc._vptr_t_doc[3])(oldStruct);
    oldStructName = (string *)CONCAT44(extraout_var,iVar5);
  }
  std::__cxx11::string::string((string *)local_70,(string *)oldStructName);
  pptVar6 = (oldStruct->members_in_id_order_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar7 = (newStruct->members_in_id_order_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
LAB_0013d652:
  do {
    pptVar3 = (oldStruct->members_in_id_order_).
              super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pptVar4 = (newStruct->members_in_id_order_).
              super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      if (pptVar6 == pptVar3) {
        if (pptVar7 == pptVar4) {
          std::__cxx11::string::~string((string *)local_70);
          return;
        }
        if (pptVar6 != pptVar3) goto LAB_0013d696;
        if ((*pptVar7)->req_ == T_REQUIRED) {
          uVar1 = (*pptVar7)->key_;
          fmt = "Required Struct Field Added for Id = %d in %s \n";
          goto LAB_0013d6ef;
        }
LAB_0013d6f6:
        pptVar7 = pptVar7 + 1;
        goto LAB_0013d652;
      }
      if (pptVar7 == pptVar4 && pptVar6 != pptVar3) {
        uVar2 = (*pptVar6)->key_;
        break;
      }
LAB_0013d696:
      newField = *pptVar7;
      uVar1 = newField->key_;
      oldField = *pptVar6;
      uVar2 = oldField->key_;
      if (uVar1 == uVar2) {
        std::__cxx11::string::string((string *)&local_50,(string *)local_70);
        compare_struct_field(newField,oldField,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        pptVar6 = pptVar6 + 1;
        goto LAB_0013d6f6;
      }
      if ((int)uVar1 < (int)uVar2) {
        fmt = "Struct field is added in the middle with Id = %d in %s\n";
LAB_0013d6ef:
        thrift_audit_failure(fmt,(ulong)uVar1,local_70[0]);
        goto LAB_0013d6f6;
      }
    } while ((int)uVar1 <= (int)uVar2);
    thrift_audit_failure("Struct Field removed for Id = %d in %s \n",(ulong)uVar2,local_70[0]);
    pptVar6 = pptVar6 + 1;
  } while( true );
}

Assistant:

void compare_single_struct(t_struct* newStruct, t_struct* oldStruct, const std::string& oldStructName = std::string())
{
   std::string structName = oldStructName.empty() ? oldStruct->get_name() : oldStructName;
   const std::vector<t_field*>& oldStructMembersInIdOrder = oldStruct->get_sorted_members();
   const std::vector<t_field*>& newStructMembersInIdOrder = newStruct->get_sorted_members();
   auto oldStructMemberIt = oldStructMembersInIdOrder.begin();
   auto newStructMemberIt = newStructMembersInIdOrder.begin();

   // Since we have the struct members in their ID order, comparing their IDs can be done by traversing the two member
   // lists together.
   while(!(oldStructMemberIt == oldStructMembersInIdOrder.end() && newStructMemberIt == newStructMembersInIdOrder.end()))
   {
      if(newStructMemberIt == newStructMembersInIdOrder.end() && oldStructMemberIt != oldStructMembersInIdOrder.end())
      {
         // A field ID has been removed from the end.
         thrift_audit_failure("Struct Field removed for Id = %d in %s \n", (*oldStructMemberIt)->get_key(), structName.c_str());
         oldStructMemberIt++;
      }
      else if(newStructMemberIt != newStructMembersInIdOrder.end() && oldStructMemberIt == oldStructMembersInIdOrder.end())
      {
         //New field ID has been added to the end.
         if((*newStructMemberIt)->get_req() == t_field::T_REQUIRED)
         {
            thrift_audit_failure("Required Struct Field Added for Id = %d in %s \n", (*newStructMemberIt)->get_key(), structName.c_str());
         }
         newStructMemberIt++;
      }
      else if((*newStructMemberIt)->get_key() == (*oldStructMemberIt)->get_key())
      {
         //Field ID found in both structs. Compare field types, default values.
         compare_struct_field(*newStructMemberIt, *oldStructMemberIt, structName);

         newStructMemberIt++;
         oldStructMemberIt++;
      }
      else if((*newStructMemberIt)->get_key() < (*oldStructMemberIt)->get_key())
      {
         //New Field Id is inserted in between
         //Adding fields to struct is fine, but adding them in the middle is suspicious. Error!!
         thrift_audit_failure("Struct field is added in the middle with Id = %d in %s\n",  (*newStructMemberIt)->get_key(),  structName.c_str());
         newStructMemberIt++;
      }
      else if((*newStructMemberIt)->get_key() > (*oldStructMemberIt)->get_key())
      {
         //A field is deleted in newStruct.
         thrift_audit_failure("Struct Field removed for Id = %d in %s \n",  (*oldStructMemberIt)->get_key(), structName.c_str());
         oldStructMemberIt++;
      }

   }
}